

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

SerialArenaChunk *
google::protobuf::internal::ThreadSafeArena::NewSerialArenaChunk
          (uint32_t prev_capacity,void *id,SerialArena *serial)

{
  Nullable<const_char_*> pcVar1;
  unsigned_long *puVar2;
  size_t t;
  char *failure_msg;
  LogMessage *pLVar3;
  LogMessage local_a0;
  Voidify local_89;
  unsigned_long local_88;
  unsigned_long local_80;
  Nullable<const_char_*> local_78;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  SizedPtr mem;
  unsigned_long uStack_58;
  uint32_t next_capacity;
  unsigned_long local_50;
  size_t next_bytes;
  size_t prev_bytes;
  size_t kEntrySize;
  size_t kHeaderSize;
  size_t kGrowthFactor;
  size_t kMaxBytes;
  SerialArena *serial_local;
  void *id_local;
  uint32_t prev_capacity_local;
  
  kGrowthFactor = 0x1000;
  kHeaderSize = 4;
  kEntrySize = 0x10;
  prev_bytes = 0x10;
  kMaxBytes = (size_t)serial;
  serial_local = (SerialArena *)id;
  id_local._4_4_ = prev_capacity;
  next_bytes = SerialArenaChunk::AllocSize((ulong)prev_capacity);
  uStack_58 = next_bytes << 2;
  puVar2 = std::min<unsigned_long>(&kGrowthFactor,&stack0xffffffffffffffa8);
  local_50 = *puVar2;
  mem.n._4_4_ = (int)local_50 - 0x10U >> 4;
  local_50 = SerialArenaChunk::AllocSize((ulong)mem.n._4_4_);
  _absl_log_internal_check_op_result = AllocateAtLeast(local_50);
  mem.n._4_4_ = absl_log_internal_check_op_result._8_4_ - 0x10U >> 4;
  t = SerialArenaChunk::AllocSize((ulong)mem.n._4_4_);
  local_80 = absl::lts_20250127::log_internal::GetReferenceableValue(t);
  local_88 = absl::lts_20250127::log_internal::GetReferenceableValue((unsigned_long)mem.p);
  local_78 = absl::lts_20250127::log_internal::Check_LEImpl<unsigned_long,unsigned_long>
                       (&local_80,&local_88,"SerialArenaChunk::AllocSize(next_capacity) <= mem.n");
  if (local_78 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_78);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_a0,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena.cc"
               ,0x2b1,failure_msg);
    pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_a0);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_89,pLVar3);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_a0);
  }
  pcVar1 = absl_log_internal_check_op_result;
  SerialArenaChunk::SerialArenaChunk
            ((SerialArenaChunk *)absl_log_internal_check_op_result,mem.n._4_4_,serial_local,
             (SerialArena *)kMaxBytes);
  return (SerialArenaChunk *)pcVar1;
}

Assistant:

ThreadSafeArena::SerialArenaChunk* ThreadSafeArena::NewSerialArenaChunk(
    uint32_t prev_capacity, void* id, SerialArena* serial) {
  constexpr size_t kMaxBytes = 4096;  // Can hold up to 255 entries.
  constexpr size_t kGrowthFactor = 4;
  constexpr size_t kHeaderSize = SerialArenaChunk::AllocSize(0);
  constexpr size_t kEntrySize = SerialArenaChunk::AllocSize(1) - kHeaderSize;

  // On x64 arch: {4, 16, 64, 256, 256, ...} * 16.
  size_t prev_bytes = SerialArenaChunk::AllocSize(prev_capacity);
  size_t next_bytes = std::min(kMaxBytes, prev_bytes * kGrowthFactor);
  uint32_t next_capacity =
      static_cast<uint32_t>(next_bytes - kHeaderSize) / kEntrySize;
  // Growth based on bytes needs to be adjusted by AllocSize.
  next_bytes = SerialArenaChunk::AllocSize(next_capacity);

  // If we allocate bigger memory than requested, we should expand
  // size to use that extra space, and add extra entries permitted
  // by the extra space.
  SizedPtr mem = AllocateAtLeast(next_bytes);
  next_capacity = static_cast<uint32_t>(mem.n - kHeaderSize) / kEntrySize;
  ABSL_DCHECK_LE(SerialArenaChunk::AllocSize(next_capacity), mem.n);
  return new (mem.p) SerialArenaChunk{next_capacity, id, serial};
}